

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

vector<std::any,_std::allocator<std::any>_> * __thiscall
Json::init_array_contents
          (vector<std::any,_std::allocator<std::any>_> *__return_storage_ptr__,Json *this,string *s,
          size_t start)

{
  char a;
  any value;
  
  (__return_storage_ptr__->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  value._M_storage._M_ptr = (void *)0x0;
  for (; start < s->_M_string_length; start = start + 1) {
    init_right_of_pair((Json *)&stack0xffffffffffffffc0,(string *)this,(size_t *)s);
    std::any::operator=(&value,(any *)&stack0xffffffffffffffc0);
    std::any::reset((any *)&stack0xffffffffffffffc0);
    std::vector<std::any,_std::allocator<std::any>_>::push_back(__return_storage_ptr__,&value);
    a = (s->_M_dataplus)._M_p[start];
    if (a == ']') break;
    this = (Json *)0x2c;
    JsonTools::expect_(a,',');
  }
  std::any::reset(&value);
  return __return_storage_ptr__;
}

Assistant:

vector<any> Json::init_array_contents(string& s, size_t start){
	vector<any> result;
	any value;
	for (size_t i = start; i < s.size(); ++i) {
		value = init_right_of_pair(s, i);
		result.push_back(value);
		if (s[i] == ']') break;
		else JsonTools::expect_(s[i], ',');
	}
	return result;
}